

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_util.hpp
# Opt level: O1

size_t __thiscall mserialize::detail::tag_first_size(detail *this,string_view tags)

{
  detail dVar1;
  long lVar2;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  const_iterator __begin2;
  detail *pdVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  
  pcVar6 = tags._ptr;
  if (pcVar6 == (char *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = (char *)0x0;
    pcVar5 = (char *)0x0;
    do {
      pcVar3 = pcVar3 + (this[(long)pcVar5] == (detail)0x5b);
      if (this[(long)pcVar5] != (detail)0x5b) break;
      bVar11 = pcVar6 + -1 != pcVar5;
      pcVar5 = pcVar5 + 1;
    } while (bVar11);
  }
  pcVar5 = pcVar3;
  if (pcVar6 < pcVar3) {
    pcVar5 = pcVar6;
  }
  lVar4 = (long)pcVar6 - (long)pcVar5;
  if (lVar4 != 0) {
    pdVar8 = this + (long)pcVar5;
    dVar1 = *pdVar8;
    if ((byte)dVar1 < 0x3c) {
      if (dVar1 == (detail)0x28) {
        lVar10 = 1;
        if (lVar4 != 1) {
          lVar7 = 1;
          lVar9 = 2;
          do {
            if (pdVar8[lVar9 + -1] == (detail)0x29) {
              lVar7 = lVar7 + -1;
              lVar10 = lVar9;
              if (lVar7 == 0) break;
            }
            else if (pdVar8[lVar9 + -1] == (detail)0x28) {
              lVar7 = lVar7 + 1;
            }
            lVar2 = lVar9 - (long)pcVar6;
            lVar9 = lVar9 + 1;
            lVar10 = lVar4;
          } while (pcVar5 + lVar2 != (char *)0x0);
        }
LAB_00113141:
        return (size_t)(pcVar3 + lVar10);
      }
      if (dVar1 == (detail)0x2f) {
        lVar10 = 1;
        if (lVar4 != 1) {
          lVar7 = 1;
          lVar9 = 2;
          do {
            if (pdVar8[lVar9 + -1] == (detail)0x5c) {
              lVar7 = lVar7 + -1;
              lVar10 = lVar9;
              if (lVar7 == 0) break;
            }
            else if (pdVar8[lVar9 + -1] == (detail)0x2f) {
              lVar7 = lVar7 + 1;
            }
            lVar2 = lVar9 - (long)pcVar6;
            lVar9 = lVar9 + 1;
            lVar10 = lVar4;
          } while (pcVar5 + lVar2 != (char *)0x0);
        }
        goto LAB_00113141;
      }
    }
    else {
      if (dVar1 == (detail)0x3c) {
        lVar10 = 1;
        if (lVar4 != 1) {
          lVar7 = 1;
          lVar9 = 2;
          do {
            if (pdVar8[lVar9 + -1] == (detail)0x3e) {
              lVar7 = lVar7 + -1;
              lVar10 = lVar9;
              if (lVar7 == 0) break;
            }
            else if (pdVar8[lVar9 + -1] == (detail)0x3c) {
              lVar7 = lVar7 + 1;
            }
            lVar2 = lVar9 - (long)pcVar6;
            lVar9 = lVar9 + 1;
            lVar10 = lVar4;
          } while (pcVar5 + lVar2 != (char *)0x0);
        }
        goto LAB_00113141;
      }
      if (dVar1 == (detail)0x7b) {
        lVar10 = 1;
        if (lVar4 != 1) {
          lVar7 = 1;
          lVar9 = 2;
          do {
            if (pdVar8[lVar9 + -1] == (detail)0x7d) {
              lVar7 = lVar7 + -1;
              lVar10 = lVar9;
              if (lVar7 == 0) break;
            }
            else if (pdVar8[lVar9 + -1] == (detail)0x7b) {
              lVar7 = lVar7 + 1;
            }
            lVar2 = lVar9 - (long)pcVar6;
            lVar9 = lVar9 + 1;
            lVar10 = lVar4;
          } while (pcVar5 + lVar2 != (char *)0x0);
        }
        goto LAB_00113141;
      }
    }
    pcVar3 = pcVar3 + 1;
  }
  return (size_t)pcVar3;
}

Assistant:

inline std::size_t tag_first_size(string_view tags)
{
  std::size_t result = 0;
  for (char c : tags)
  {
    if (c != '[') { break; }
    ++result;
  }
  tags.remove_prefix(result);

  if (! tags.empty())
  {
    switch (tags.front())
    {
    case '(':
      result += size_between_balanced(tags, '(', ')');
      break;
    case '<':
      result += size_between_balanced(tags, '<', '>');
      break;
    case '{':
      result += size_between_balanced(tags, '{', '}');
      break;
    case '/':
      result += size_between_balanced(tags, '/', '\\');
      break;
    default:
      result += 1; // assume arithmetic
      break;
    }
  }

  return result;
}